

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

int duckdb::BitwiseShiftLeftOperator::Operation<int,int,int>(int input,int shift)

{
  OutOfRangeException *pOVar1;
  bool bVar2;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (input < 0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Cannot left-shift negative number %s","");
    NumericHelper::ToString<int>(&local_40,input);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (-1 < shift) {
    if (shift < 0x20) {
      if (shift != 0) {
        if ((int)(0x80000000U >> ((byte)shift & 0x1f)) <= input) {
          pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Overflow in left shift (%s << %s)","");
          NumericHelper::ToString<int>(&local_a0,input);
          NumericHelper::ToString<int>(&local_c0,shift);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar1,&local_e0,&local_a0,&local_c0);
          __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        input = input << ((byte)shift & 0x1f);
      }
    }
    else {
      bVar2 = input != 0;
      input = 0;
      if (bVar2) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Left-shift value %s is out of range","");
        NumericHelper::ToString<int>(&local_80,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_80);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    return input;
  }
  pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Cannot left-shift by negative number %s","");
  NumericHelper::ToString<int>(&local_60,shift);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_60);
  __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}